

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O0

void irr::video::CColorConverter::convert_R8G8B8toB8G8R8(void *sP,s32 sN,void *dP)

{
  s32 x;
  u8 *dB;
  u8 *sB;
  void *dP_local;
  s32 sN_local;
  void *sP_local;
  
  dB = (u8 *)dP;
  sB = (u8 *)sP;
  for (x = 0; x < sN; x = x + 1) {
    dB[2] = *sB;
    dB[1] = sB[1];
    *dB = sB[2];
    sB = sB + 3;
    dB = dB + 3;
  }
  return;
}

Assistant:

void CColorConverter::convert_R8G8B8toB8G8R8(const void *sP, s32 sN, void *dP)
{
	u8 *sB = (u8 *)sP;
	u8 *dB = (u8 *)dP;

	for (s32 x = 0; x < sN; ++x) {
		dB[2] = sB[0];
		dB[1] = sB[1];
		dB[0] = sB[2];

		sB += 3;
		dB += 3;
	}
}